

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O2

void testMultiTiledPartThreading(string *tempDir)

{
  LineOrder LVar1;
  Compression CVar2;
  uint *puVar3;
  char cVar4;
  pointer pTVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  __type _Var8;
  bool ytc;
  bool ytc_00;
  bool ytc_01;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ostream *poVar17;
  long lVar18;
  ChannelList *pCVar19;
  ThreadPool *pTVar20;
  WritingTask *pWVar21;
  Header *pHVar22;
  Box2i *pBVar23;
  Box2i *pBVar24;
  float *pfVar25;
  V2f *pVVar26;
  V2f *pVVar27;
  LineOrder *pLVar28;
  Compression *pCVar29;
  ChannelList *other;
  string *psVar30;
  string *psVar31;
  ReadingTask *pRVar32;
  undefined1 *puVar33;
  long lVar34;
  int iVar35;
  int i;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  half *phVar40;
  ulong uVar41;
  ulong uVar42;
  undefined8 in_R10;
  long lVar43;
  long lVar44;
  int startY;
  int iVar45;
  int *piVar46;
  ulong uVar47;
  stringstream *psVar48;
  float fVar49;
  ulong local_3c8;
  half local_37a;
  vector<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_> parts;
  MultiPartOutputFile file;
  Header header;
  Array2D<half> halfData [2];
  Array2D<unsigned_int> uintData [2];
  Array2D<float> floatData [2];
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  string *local_230;
  ulong local_228;
  size_t local_220;
  string fn;
  string typeNames [2];
  stringstream ss;
  float fStack_1b4;
  undefined4 local_1b0 [2];
  long local_1a8 [47];
  
  poVar17 = std::operator<<((ostream *)&std::cout,
                            "Testing the two threads reading/writing on two-tiled-part file");
  std::endl<char,std::char_traits<char>>(poVar17);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar9 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar9);
  uVar36 = 0;
  local_230 = tempDir;
  do {
    if ((int)uVar36 == 3) {
      iVar9 = IlmThread_2_5::ThreadPool::globalThreadPool();
      IlmThread_2_5::ThreadPool::setNumThreads(iVar9);
      poVar17 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar17);
      return;
    }
    local_228 = uVar36;
    for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
      for (uVar38 = 0; uVar38 != 3; uVar38 = uVar38 + 1) {
        uVar16 = 1;
        while( true ) {
          if (0xc4 < uVar16) break;
          (anonymous_namespace)::pixelTypes = (undefined4)uVar36;
          DAT_00425da4 = iVar9;
          (anonymous_namespace)::levelMode = uVar38;
          (anonymous_namespace)::tileSize = uVar16;
          std::operator+(&fn,tempDir,"imf_test_multi_tiled_part_threading.exr");
          lVar18 = 0x10;
          do {
            puVar33 = (undefined1 *)((long)&typeNames[0]._M_dataplus._M_p + lVar18);
            *(undefined1 **)((long)typeNames + lVar18 + -0x10) = puVar33;
            *(undefined8 *)((long)typeNames + lVar18 + -8) = 0;
            *puVar33 = 0;
            lVar18 = lVar18 + 0x20;
          } while (lVar18 != 0x50);
          local_248 = 0;
          local_240[0] = 0;
          psVar30 = typeNames;
          local_250 = local_240;
          for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 4) {
            if (*(uint *)((long)&(anonymous_namespace)::pixelTypes + lVar18) < 3) {
              std::__cxx11::string::assign((char *)psVar30);
            }
            if ((anonymous_namespace)::levelMode < 3) {
              std::__cxx11::string::assign((char *)&local_250);
            }
            psVar30 = psVar30 + 1;
          }
          poVar17 = std::operator<<((ostream *)&std::cout,"part 1: type ");
          poVar17 = std::operator<<(poVar17,(string *)typeNames);
          poVar17 = std::operator<<(poVar17," tiled part, ");
          poVar17 = std::operator<<(poVar17,"part 2: type ");
          poVar17 = std::operator<<(poVar17,(string *)(typeNames + 1));
          poVar17 = std::operator<<(poVar17," tiled part, ");
          poVar17 = std::operator<<(poVar17,"level mode ");
          poVar17 = std::operator<<(poVar17,(string *)&local_250);
          poVar17 = std::operator<<(poVar17," tile size ");
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(anonymous_namespace)::tileSize);
          poVar17 = std::operator<<(poVar17,"x");
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(anonymous_namespace)::tileSize);
          std::endl<char,std::char_traits<char>>(poVar17);
          std::ostream::flush();
          std::operator<<((ostream *)&std::cout,"Generating headers ");
          std::ostream::flush();
          std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::clear
                    ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                     &(anonymous_namespace)::headers);
          piVar46 = &(anonymous_namespace)::pixelTypes;
          for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
            _ss = 0.0;
            fStack_1b4 = 0.0;
            Imf_2_5::Header::Header
                      (&header,0xc5,0x107,1.0,(V2f *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
            iVar10 = *piVar46;
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::ostream::operator<<(local_1a8,(int)lVar18);
            std::__cxx11::stringbuf::str();
            Imf_2_5::Header::setName(&header,(string *)halfData);
            std::__cxx11::string::~string((string *)halfData);
            if (iVar10 == 0) {
              pCVar19 = Imf_2_5::Header::channels(&header);
              Imf_2_5::Channel::Channel((Channel *)halfData,UINT,1,1,false);
              Imf_2_5::ChannelList::insert(pCVar19,"UINT",(Channel *)halfData);
            }
            else if (iVar10 == 1) {
              pCVar19 = Imf_2_5::Header::channels(&header);
              Imf_2_5::Channel::Channel((Channel *)halfData,FLOAT,1,1,false);
              Imf_2_5::ChannelList::insert(pCVar19,"FLOAT",(Channel *)halfData);
            }
            else if (iVar10 == 2) {
              pCVar19 = Imf_2_5::Header::channels(&header);
              Imf_2_5::Channel::Channel((Channel *)halfData,HALF,1,1,false);
              Imf_2_5::ChannelList::insert(pCVar19,"HALF",(Channel *)halfData);
            }
            Imf_2_5::Header::setType(&header,(string *)Imf_2_5::TILEDIMAGE_abi_cxx11_);
            uVar12 = (anonymous_namespace)::levelMode;
            if (2 < (anonymous_namespace)::levelMode) {
              uVar12 = 3;
            }
            halfData[0]._sizeX =
                 CONCAT44((anonymous_namespace)::tileSize,(anonymous_namespace)::tileSize);
            halfData[0]._sizeY = (long)uVar12;
            Imf_2_5::Header::setTileDescription(&header,(TileDescription *)halfData);
            std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                      ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                       &(anonymous_namespace)::headers,&header);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            Imf_2_5::Header::~Header(&header);
            piVar46 = piVar46 + 1;
          }
          remove(fn._M_dataplus._M_p);
          _Var6 = fn._M_dataplus;
          lVar18 = DAT_00425d90;
          pHVar22 = (anonymous_namespace)::headers;
          iVar10 = Imf_2_5::globalThreadCount();
          Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
                    (&file,_Var6._M_p,pHVar22,(int)((lVar18 - (long)pHVar22) / 0x38),false,iVar10);
          parts.
          super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          parts.
          super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          halfData[1]._sizeY = 0;
          halfData[1]._data = (half *)0x0;
          halfData[0]._data = (half *)0x0;
          halfData[1]._sizeX = 0;
          halfData[0]._sizeX = 0;
          halfData[0]._sizeY = 0;
          floatData[1]._sizeY = 0;
          floatData[1]._data = (float *)0x0;
          floatData[0]._data = (float *)0x0;
          floatData[1]._sizeX = 0;
          floatData[0]._sizeX = 0;
          floatData[0]._sizeY = 0;
          uintData[1]._sizeY = 0;
          uintData[1]._data = (uint *)0x0;
          uintData[0]._data = (uint *)0x0;
          uintData[1]._sizeX = 0;
          uintData[0]._sizeX = 0;
          uintData[0]._sizeY = 0;
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            Imf_2_5::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&ss,&file,iVar10);
            std::vector<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>::
            push_back(&parts,(value_type *)&ss);
          }
          std::operator<<((ostream *)&std::cout,"Writing files ");
          std::ostream::flush();
          pTVar5 = parts.
                   super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = Imf_2_5::TiledOutputPart::numXLevels
                             (parts.
                              super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          iVar11 = Imf_2_5::TiledOutputPart::numYLevels(pTVar5);
          iVar37 = 0;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          for (; iVar37 != iVar10; iVar37 = iVar37 + 1) {
            for (iVar35 = 0; iVar35 != iVar11; iVar35 = iVar35 + 1) {
              bVar7 = Imf_2_5::TiledOutputPart::isValidLevel(pTVar5,iVar37,iVar35);
              if (bVar7) {
                uVar12 = Imf_2_5::TiledOutputPart::levelWidth(pTVar5,iVar37);
                uVar13 = Imf_2_5::TiledOutputPart::levelHeight(pTVar5,iVar35);
                lVar18 = 0;
                do {
                  *(undefined4 *)((long)local_1b0 + lVar18) = 0;
                  *(undefined8 *)((long)local_1a8 + lVar18) = 0;
                  *(long *)((long)local_1a8 + lVar18 + 8) = (long)local_1b0 + lVar18;
                  *(long *)((long)local_1a8 + lVar18 + 0x10) = (long)local_1b0 + lVar18;
                  *(undefined8 *)((long)local_1a8 + lVar18 + 0x18) = 0;
                  lVar18 = lVar18 + 0x30;
                } while (lVar18 != 0x60);
                lVar18 = (long)(int)uVar13;
                lVar34 = (long)(int)uVar12;
                uVar36 = 0;
                if (0 < (int)uVar12) {
                  uVar36 = (ulong)uVar12;
                }
                uVar47 = 0;
                if (0 < (int)uVar13) {
                  uVar47 = (ulong)uVar13;
                }
                local_220 = lVar34 * 2;
                for (lVar44 = 0; lVar44 != 2; lVar44 = lVar44 + 1) {
                  iVar14 = (&(anonymous_namespace)::pixelTypes)[lVar44];
                  if (iVar14 == 2) {
                    Imf_2_5::Array2D<half>::resizeErase(halfData + lVar44,lVar18,lVar34);
                    iVar14 = 0;
                    lVar39 = 0;
                    for (uVar41 = 0; uVar41 != uVar47; uVar41 = uVar41 + 1) {
                      iVar45 = iVar14;
                      for (uVar42 = 0; (uint)((int)uVar36 * 2) != uVar42; uVar42 = uVar42 + 2) {
                        half::operator=((half *)((long)&(halfData[lVar44]._data)->_h +
                                                uVar42 + halfData[lVar44]._sizeY * lVar39),
                                        (float)(iVar45 % 0x801));
                        iVar45 = iVar45 + 1;
                      }
                      lVar39 = lVar39 + 2;
                      iVar14 = iVar14 + uVar12;
                    }
LAB_0016766b:
                    iVar14 = (&(anonymous_namespace)::pixelTypes)[lVar44];
                  }
                  else {
                    if (iVar14 == 1) {
                      Imf_2_5::Array2D<float>::resizeErase(floatData + lVar44,lVar18,lVar34);
                      iVar14 = 0;
                      lVar39 = 0;
                      for (uVar41 = 0; uVar41 != uVar47; uVar41 = uVar41 + 1) {
                        lVar43 = floatData[lVar44]._sizeY;
                        pfVar25 = floatData[lVar44]._data;
                        in_R10 = 0x801;
                        for (uVar42 = 0; uVar36 != uVar42; uVar42 = uVar42 + 1) {
                          *(float *)((long)pfVar25 + uVar42 * 4 + lVar43 * lVar39) =
                               (float)((iVar14 + (int)uVar42) % 0x801);
                        }
                        lVar39 = lVar39 + 4;
                        iVar14 = iVar14 + uVar12;
                      }
                      goto LAB_0016766b;
                    }
                    if (iVar14 == 0) {
                      Imf_2_5::Array2D<unsigned_int>::resizeErase(uintData + lVar44,lVar18,lVar34);
                      iVar14 = 0;
                      lVar39 = 0;
                      for (uVar41 = 0; uVar41 != uVar47; uVar41 = uVar41 + 1) {
                        lVar43 = uintData[lVar44]._sizeY;
                        puVar3 = uintData[lVar44]._data;
                        in_R10 = 0x801;
                        for (uVar42 = 0; uVar36 != uVar42; uVar42 = uVar42 + 1) {
                          *(int *)((long)puVar3 + uVar42 * 4 + lVar43 * lVar39) =
                               (iVar14 + (int)uVar42) % 0x801;
                        }
                        lVar39 = lVar39 + 4;
                        iVar14 = iVar14 + uVar12;
                      }
                      goto LAB_0016766b;
                    }
                  }
                  psVar48 = &ss + lVar44 * 0x30;
                  bVar7 = SUB81(in_R10,0);
                  cVar4 = (char)lVar44;
                  if (iVar14 == 2) {
                    Imf_2_5::Slice::Slice
                              ((Slice *)&header,HALF,(char *)halfData[lVar44]._data,2,local_220,1,1,
                               0.0,bVar7,(bool)(cVar4 * '\x18'));
                    Imf_2_5::FrameBuffer::insert((FrameBuffer *)psVar48,"HALF",(Slice *)&header);
                  }
                  else if (iVar14 == 1) {
                    Imf_2_5::Slice::Slice
                              ((Slice *)&header,FLOAT,(char *)floatData[lVar44]._data,4,lVar34 * 4,1
                               ,1,0.0,bVar7,(bool)(cVar4 * '\x18'));
                    Imf_2_5::FrameBuffer::insert((FrameBuffer *)psVar48,"FLOAT",(Slice *)&header);
                  }
                  else if (iVar14 == 0) {
                    Imf_2_5::Slice::Slice
                              ((Slice *)&header,UINT,(char *)uintData[lVar44]._data,4,lVar34 * 4,1,1
                               ,0.0,bVar7,(bool)(cVar4 * '\x18'));
                    Imf_2_5::FrameBuffer::insert((FrameBuffer *)psVar48,"UINT",(Slice *)&header);
                  }
                  Imf_2_5::TiledOutputPart::setFrameBuffer
                            (parts.
                             super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar44,
                             (FrameBuffer *)psVar48);
                }
                IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)&header);
                pTVar20 = (ThreadPool *)operator_new(0x10);
                IlmThread_2_5::ThreadPool::ThreadPool(pTVar20,2);
                iVar45 = Imf_2_5::TiledOutputPart::numXTiles(pTVar5,iVar37);
                iVar15 = Imf_2_5::TiledOutputPart::numYTiles(pTVar5,iVar35);
                iVar14 = 0;
                if (iVar15 < 1) {
                  iVar15 = 0;
                  iVar14 = 0;
                }
                for (; iVar15 != iVar14; iVar14 = iVar14 + 1) {
                  pWVar21 = (WritingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1ca3bb::WritingTask::WritingTask
                            (pWVar21,(TaskGroup *)&header,
                             parts.
                             super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar37,iVar35,iVar14,iVar45);
                  IlmThread_2_5::ThreadPool::addTask((Task *)pTVar20);
                  pWVar21 = (WritingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1ca3bb::WritingTask::WritingTask
                            (pWVar21,(TaskGroup *)&header,
                             parts.
                             super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1,iVar37,iVar35,iVar14,
                             iVar45);
                  IlmThread_2_5::ThreadPool::addTask((Task *)pTVar20);
                }
                (**(code **)(*(long *)pTVar20 + 8))(pTVar20);
                IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)&header);
                lVar18 = 0x30;
                do {
                  std::
                  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                               *)(&ss + lVar18));
                  lVar18 = lVar18 + -0x30;
                } while (lVar18 != -0x30);
              }
            }
          }
          lVar18 = 0x18;
          do {
            Imf_2_5::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)((long)&uintData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_2_5::Array2D<float>::~Array2D
                      ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)((long)&halfData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          std::_Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>::
          ~_Vector_base(&parts.
                         super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                       );
          Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile(&file);
          std::operator<<((ostream *)&std::cout,"Checking headers ");
          std::ostream::flush();
          _Var6 = fn._M_dataplus;
          iVar10 = Imf_2_5::globalThreadCount();
          Imf_2_5::MultiPartInputFile::MultiPartInputFile
                    ((MultiPartInputFile *)&file,_Var6._M_p,iVar10,true);
          iVar10 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)&file);
          if (iVar10 != 2) {
            __assert_fail("file.parts() == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                          ,0x178,"void (anonymous namespace)::readFiles(const std::string &)");
          }
          lVar34 = 0;
          lVar18 = 0;
          while (lVar18 != 2) {
            pHVar22 = Imf_2_5::MultiPartInputFile::header((MultiPartInputFile *)&file,(int)lVar18);
            pBVar23 = Imf_2_5::Header::displayWindow(pHVar22);
            pBVar24 = Imf_2_5::Header::displayWindow
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar23,pBVar24);
            if (!bVar7) {
              __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x17c,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pBVar23 = Imf_2_5::Header::dataWindow(pHVar22);
            pBVar24 = Imf_2_5::Header::dataWindow
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar23,pBVar24);
            if (!bVar7) {
              __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x17d,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar25 = Imf_2_5::Header::pixelAspectRatio(pHVar22);
            fVar49 = *pfVar25;
            pfVar25 = Imf_2_5::Header::pixelAspectRatio
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            if ((fVar49 != *pfVar25) || (NAN(fVar49) || NAN(*pfVar25))) {
              __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x17e,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pVVar26 = Imf_2_5::Header::screenWindowCenter(pHVar22);
            pVVar27 = Imf_2_5::Header::screenWindowCenter
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            if ((((pVVar26->x != pVVar27->x) || (NAN(pVVar26->x) || NAN(pVVar27->x))) ||
                (pVVar26->y != pVVar27->y)) || (NAN(pVVar26->y) || NAN(pVVar27->y))) {
              __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x17f,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pfVar25 = Imf_2_5::Header::screenWindowWidth(pHVar22);
            fVar49 = *pfVar25;
            pfVar25 = Imf_2_5::Header::screenWindowWidth
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            if ((fVar49 != *pfVar25) || (NAN(fVar49) || NAN(*pfVar25))) {
              __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x180,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pLVar28 = Imf_2_5::Header::lineOrder(pHVar22);
            LVar1 = *pLVar28;
            pLVar28 = Imf_2_5::Header::lineOrder
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            if (LVar1 != *pLVar28) {
              __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x181,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pCVar29 = Imf_2_5::Header::compression(pHVar22);
            CVar2 = *pCVar29;
            pCVar29 = Imf_2_5::Header::compression
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            if (CVar2 != *pCVar29) {
              __assert_fail("header.compression() == headers[i].compression()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x182,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            pCVar19 = Imf_2_5::Header::channels(pHVar22);
            other = Imf_2_5::Header::channels
                              ((Header *)
                               (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                               lVar34));
            bVar7 = Imf_2_5::ChannelList::operator==(pCVar19,other);
            if (!bVar7) {
              __assert_fail("header.channels() == headers[i].channels()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x183,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            psVar30 = Imf_2_5::Header::name_abi_cxx11_(pHVar22);
            psVar31 = Imf_2_5::Header::name_abi_cxx11_
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            _Var8 = std::operator==(psVar30,psVar31);
            if (!_Var8) {
              __assert_fail("header.name() == headers[i].name()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x184,"void (anonymous namespace)::readFiles(const std::string &)");
            }
            psVar30 = Imf_2_5::Header::type_abi_cxx11_(pHVar22);
            psVar31 = Imf_2_5::Header::type_abi_cxx11_
                                ((Header *)
                                 (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                                 lVar34));
            _Var8 = std::operator==(psVar30,psVar31);
            lVar18 = lVar18 + 1;
            lVar34 = lVar34 + 0x38;
            if (!_Var8) {
              __assert_fail("header.type() == headers[i].type()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                            ,0x185,"void (anonymous namespace)::readFiles(const std::string &)");
            }
          }
          halfData[1]._sizeY = 0;
          halfData[1]._data = (half *)0x0;
          halfData[0]._data = (half *)0x0;
          halfData[1]._sizeX = 0;
          halfData[0]._sizeX = 0;
          halfData[0]._sizeY = 0;
          floatData[1]._sizeY = 0;
          floatData[1]._data = (float *)0x0;
          floatData[0]._data = (float *)0x0;
          floatData[1]._sizeX = 0;
          floatData[0]._sizeX = 0;
          floatData[0]._sizeY = 0;
          uintData[1]._sizeY = 0;
          uintData[1]._data = (uint *)0x0;
          uintData[0]._data = (uint *)0x0;
          uintData[1]._sizeX = 0;
          uintData[0]._sizeX = 0;
          uintData[0]._sizeY = 0;
          parts.
          super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          parts.
          super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          parts.
          super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            Imf_2_5::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&ss,(MultiPartInputFile *)&file,iVar10);
            std::vector<Imf_2_5::TiledInputPart,_std::allocator<Imf_2_5::TiledInputPart>_>::
            push_back((vector<Imf_2_5::TiledInputPart,_std::allocator<Imf_2_5::TiledInputPart>_> *)
                      &parts,(value_type *)&ss);
          }
          std::operator<<((ostream *)&std::cout,"Reading and comparing files ");
          std::ostream::flush();
          pTVar5 = parts.
                   super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar11 = Imf_2_5::TiledInputPart::numXLevels
                             ((TiledInputPart *)
                              parts.
                              super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          iVar10 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)pTVar5);
          iVar37 = 0;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          for (; iVar37 != iVar11; iVar37 = iVar37 + 1) {
            for (iVar35 = 0; iVar35 != iVar10; iVar35 = iVar35 + 1) {
              bVar7 = Imf_2_5::TiledInputPart::isValidLevel((TiledInputPart *)pTVar5,iVar37,iVar35);
              if (bVar7) {
                iVar14 = Imf_2_5::TiledInputPart::levelWidth((TiledInputPart *)pTVar5,iVar37);
                uVar12 = Imf_2_5::TiledInputPart::levelHeight((TiledInputPart *)pTVar5,iVar35);
                lVar18 = 0;
                do {
                  *(undefined4 *)((long)local_1b0 + lVar18) = 0;
                  *(undefined8 *)((long)local_1a8 + lVar18) = 0;
                  *(long *)((long)local_1a8 + lVar18 + 8) = (long)local_1b0 + lVar18;
                  *(long *)((long)local_1a8 + lVar18 + 0x10) = (long)local_1b0 + lVar18;
                  *(undefined8 *)((long)local_1a8 + lVar18 + 0x18) = 0;
                  lVar18 = lVar18 + 0x30;
                } while (lVar18 != 0x60);
                lVar18 = (long)(int)uVar12;
                lVar34 = (long)iVar14;
                psVar48 = &ss;
                piVar46 = &(anonymous_namespace)::pixelTypes;
                lVar39 = 0;
                for (lVar44 = 0; lVar44 != 0x30; lVar44 = lVar44 + 0x18) {
                  iVar45 = *piVar46;
                  if (iVar45 == 2) {
                    Imf_2_5::Array2D<half>::resizeErase
                              ((Array2D<half> *)((long)&uintData[0]._sizeX + lVar44),lVar18,lVar34);
                    Imf_2_5::Slice::Slice
                              ((Slice *)&header,HALF,*(char **)((long)&uintData[0]._data + lVar44),2
                               ,lVar34 * 2,1,1,0.0,SUB81(in_R10,0),ytc_01);
                    Imf_2_5::FrameBuffer::insert((FrameBuffer *)psVar48,"HALF",(Slice *)&header);
                  }
                  else if (iVar45 == 1) {
                    Imf_2_5::Array2D<float>::resizeErase
                              ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar44),lVar18,lVar34
                              );
                    Imf_2_5::Slice::Slice
                              ((Slice *)&header,FLOAT,*(char **)((long)&floatData[0]._data + lVar44)
                               ,4,lVar34 * 4,1,1,0.0,SUB81(in_R10,0),ytc_00);
                    Imf_2_5::FrameBuffer::insert((FrameBuffer *)psVar48,"FLOAT",(Slice *)&header);
                  }
                  else if (iVar45 == 0) {
                    Imf_2_5::Array2D<unsigned_int>::resizeErase
                              ((Array2D<unsigned_int> *)((long)&halfData[0]._sizeX + lVar44),lVar18,
                               lVar34);
                    Imf_2_5::Slice::Slice
                              ((Slice *)&header,UINT,*(char **)((long)&halfData[0]._data + lVar44),4
                               ,lVar34 * 4,1,1,0.0,SUB81(in_R10,0),ytc);
                    Imf_2_5::FrameBuffer::insert((FrameBuffer *)psVar48,"UINT",(Slice *)&header);
                  }
                  Imf_2_5::TiledInputPart::setFrameBuffer
                            ((TiledInputPart *)
                             ((long)&(parts.
                                      super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->file + lVar39),
                             (FrameBuffer *)psVar48);
                  lVar39 = lVar39 + 8;
                  piVar46 = piVar46 + 1;
                  psVar48 = psVar48 + 0x30;
                }
                IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)&header);
                pTVar20 = (ThreadPool *)operator_new(0x10);
                IlmThread_2_5::ThreadPool::ThreadPool(pTVar20,2);
                iVar15 = Imf_2_5::TiledInputPart::numXTiles((TiledInputPart *)pTVar5,iVar37);
                iVar45 = Imf_2_5::TiledInputPart::numYTiles((TiledInputPart *)pTVar5,iVar35);
                startY = 0;
                if (iVar45 < 1) {
                  iVar45 = startY;
                }
                for (; iVar45 != startY; startY = startY + 1) {
                  pRVar32 = (ReadingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1ca3bb::ReadingTask::ReadingTask
                            (pRVar32,(TaskGroup *)&header,
                             (TiledInputPart *)
                             parts.
                             super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar37,iVar35,startY,iVar15);
                  IlmThread_2_5::ThreadPool::addTask((Task *)pTVar20);
                  pRVar32 = (ReadingTask *)operator_new(0x28);
                  anon_unknown.dwarf_1ca3bb::ReadingTask::ReadingTask
                            (pRVar32,(TaskGroup *)&header,
                             (TiledInputPart *)
                             (parts.
                              super__Vector_base<Imf_2_5::TiledOutputPart,_std::allocator<Imf_2_5::TiledOutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1),iVar37,iVar35,startY,
                             iVar15);
                  IlmThread_2_5::ThreadPool::addTask((Task *)pTVar20);
                }
                (**(code **)(*(long *)pTVar20 + 8))();
                iVar45 = iVar14 + -1;
                if (iVar14 + -1 < 0) {
                  iVar45 = -1;
                }
                lVar18 = (long)iVar45 + 1;
                uVar36 = 0;
                if (0 < (int)uVar12) {
                  uVar36 = (ulong)uVar12;
                }
                lVar34 = (long)(int)(uVar12 - 1);
                for (lVar44 = 0; lVar44 != 2; lVar44 = lVar44 + 1) {
                  iVar45 = (&(anonymous_namespace)::pixelTypes)[lVar44];
                  if (iVar45 == 2) {
                    iVar45 = 0;
                    lVar39 = 0;
                    for (uVar47 = 0; local_3c8 = uVar36, uVar47 != uVar36; uVar47 = uVar47 + 1) {
                      for (lVar43 = 0; lVar18 != lVar43; lVar43 = lVar43 + 1) {
                        fVar49 = *(float *)((long)&half::_toFloat +
                                           (ulong)*(ushort *)
                                                   ((long)uintData[lVar44]._data +
                                                   lVar43 * 2 + uintData[lVar44]._sizeY * lVar39) *
                                           4);
                        iVar15 = (iVar45 + (int)lVar43) % 0x801;
                        half::half(&local_37a,(float)iVar15);
                        pfVar25 = (float *)((long)&half::_toFloat + (ulong)local_37a._h * 4);
                        if ((fVar49 != *pfVar25) || (NAN(fVar49) || NAN(*pfVar25))) {
                          poVar17 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)lVar43);
                          poVar17 = std::operator<<(poVar17,", ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)uVar47);
                          poVar17 = std::operator<<(poVar17,": ");
                          poVar17 = (ostream *)
                                    operator<<(poVar17,(half *)(ulong)*(ushort *)
                                                                       ((long)uintData[lVar44]._data
                                                                       + lVar43 * 2 +
                                                                         lVar39 * uintData[lVar44].
                                                                                  _sizeY));
                          poVar17 = std::operator<<(poVar17,", should be ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15);
                          std::endl<char,std::char_traits<char>>(poVar17);
                          std::ostream::flush();
                          local_3c8 = uVar47;
                          goto LAB_00168392;
                        }
                      }
                      lVar39 = lVar39 + 2;
                      iVar45 = iVar45 + iVar14;
                    }
LAB_00168392:
                    if ((long)local_3c8 <= lVar34) {
                      __assert_fail("checkPixels<half>(hData[i], w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                                    ,0x1d1,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                  else if (iVar45 == 1) {
                    pfVar25 = floatData[lVar44]._data;
                    iVar45 = 0;
                    lVar39 = 0;
                    for (uVar47 = 0; uVar41 = uVar36, uVar47 != uVar36; uVar47 = uVar47 + 1) {
                      for (lVar43 = 0; lVar18 != lVar43; lVar43 = lVar43 + 1) {
                        iVar15 = (iVar45 + (int)lVar43) % 0x801;
                        fVar49 = (float)iVar15;
                        if ((pfVar25[lVar43] != fVar49) || (NAN(pfVar25[lVar43]) || NAN(fVar49))) {
                          poVar17 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)lVar43);
                          poVar17 = std::operator<<(poVar17,", ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)uVar47);
                          poVar17 = std::operator<<(poVar17,": ");
                          poVar17 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar17,*(float *)((long)floatData[lVar44]._data +
                                                                 lVar43 * 4 +
                                                                 lVar39 * floatData[lVar44]._sizeY))
                          ;
                          poVar17 = std::operator<<(poVar17,", should be ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15);
                          std::endl<char,std::char_traits<char>>(poVar17);
                          std::ostream::flush();
                          uVar41 = uVar47;
                          goto LAB_00168249;
                        }
                      }
                      lVar39 = lVar39 + 4;
                      iVar45 = iVar45 + iVar14;
                      pfVar25 = pfVar25 + floatData[lVar44]._sizeY;
                    }
LAB_00168249:
                    if ((long)uVar41 <= lVar34) {
                      __assert_fail("checkPixels<float>(fData[i], w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                                    ,0x1ce,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                  else if (iVar45 == 0) {
                    phVar40 = halfData[lVar44]._data;
                    iVar45 = 0;
                    for (uVar47 = 0; uVar41 = uVar36, uVar47 != uVar36; uVar47 = uVar47 + 1) {
                      for (lVar39 = 0; lVar18 != lVar39; lVar39 = lVar39 + 1) {
                        iVar15 = (iVar45 + (int)lVar39) % 0x801;
                        if (*(int *)(phVar40 + lVar39 * 2) != iVar15) {
                          poVar17 = std::operator<<((ostream *)&std::cout,"value at ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)lVar39);
                          poVar17 = std::operator<<(poVar17,", ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,(int)uVar47);
                          poVar17 = std::operator<<(poVar17,": ");
                          poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
                          poVar17 = std::operator<<(poVar17,", should be ");
                          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15);
                          std::endl<char,std::char_traits<char>>(poVar17);
                          std::ostream::flush();
                          uVar41 = uVar47;
                          goto LAB_001682ea;
                        }
                      }
                      iVar45 = iVar45 + iVar14;
                      phVar40 = phVar40 + halfData[lVar44]._sizeY * 2;
                    }
LAB_001682ea:
                    if ((long)uVar41 <= lVar34) {
                      __assert_fail("checkPixels<unsigned int>(uData[i], w, h)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiTiledPartThreading.cpp"
                                    ,0x1cb,
                                    "void (anonymous namespace)::readFiles(const std::string &)");
                    }
                  }
                }
                IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)&header);
                lVar18 = 0x30;
                do {
                  std::
                  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                               *)(&ss + lVar18));
                  lVar18 = lVar18 + -0x30;
                } while (lVar18 != -0x30);
              }
            }
          }
          std::_Vector_base<Imf_2_5::TiledInputPart,_std::allocator<Imf_2_5::TiledInputPart>_>::
          ~_Vector_base((_Vector_base<Imf_2_5::TiledInputPart,_std::allocator<Imf_2_5::TiledInputPart>_>
                         *)&parts);
          lVar18 = 0x18;
          do {
            Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)((long)&uintData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_2_5::Array2D<float>::~Array2D
                      ((Array2D<float> *)((long)&floatData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          lVar18 = 0x18;
          do {
            Imf_2_5::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)((long)&halfData[0]._sizeX + lVar18));
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != -0x18);
          Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&file);
          remove(fn._M_dataplus._M_p);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::ostream::flush();
          std::__cxx11::string::~string((string *)&local_250);
          lVar18 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&typeNames[0]._M_dataplus._M_p + lVar18))
            ;
            lVar18 = lVar18 + -0x20;
          } while (lVar18 != -0x20);
          std::__cxx11::string::~string((string *)&fn);
          uVar16 = uVar16 + 0x32;
          uVar36 = local_228;
          tempDir = local_230;
        }
      }
    }
    uVar36 = (ulong)((int)uVar36 + 1);
  } while( true );
}

Assistant:

void testMultiTiledPartThreading (const std::string & tempDir)
{
    try
    {
        cout << "Testing the two threads reading/writing on two-tiled-part file" << endl;

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(2);

        for (int pt1 = 0; pt1 < 3; pt1++)
            for (int pt2 = 0; pt2 < 3; pt2++)
                for (int lm = 0; lm < 3; lm++)
                    for (int size = 1; size < min(width, height); size += 50)
                    {
                        pixelTypes[0] = pt1;
                        pixelTypes[1] = pt2;
                        levelMode = lm;
                        tileSize = size;
                        testWriteRead (tempDir);
                    }

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}